

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O3

void __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<double,i1,i2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,double>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i1,std::default_delete<i1>>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i2,std::default_delete<i2>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
injector<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<double>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,double>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i2,impl2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<double,i1,i2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,double>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i1,std::default_delete<i1>>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i2,std::default_delete<i2>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
          (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<double,i1,i2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,double>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i1,std::default_delete<i1>>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::unique_ptr<i2,std::default_delete<i2>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
           *this,from_injector *param_1,
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<double>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_impl2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          *injector,
          type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          *param_3)

{
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  sVar1;
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  local_30;
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  local_28;
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  local_20;
  
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  ::
  scope<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<double>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_impl2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>,_0>
            (&local_30,injector);
  sVar1.injector_ = local_30.injector_;
  local_30.injector_ = (injector *)0x0;
  local_28.injector_ = (injector *)0x0;
  *(injector **)this = sVar1.injector_;
  local_20.injector_ = (injector *)0x0;
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  ::~scope(&local_20);
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  ::~scope(&local_28);
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<double,_i1,_i2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_double>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i2,_std::default_delete<i2>_>_>_>,_int>
  ::~scope(&local_30);
  return;
}

Assistant:

pool_t{bindings_t<TArgs...>{},
               pool_t {
                 build<TArgs>(static_cast<TInjector&&>(injector))...
               }}
#else
      : pool_t{bindings_t<TArgs...>{},
               pool_t {
                 TArgs{static_cast<TInjector&&>(injector)}...
               }}
#endif
  {
  }